

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_frame.hpp
# Opt level: O1

void asd::detail::read_frame_header_impl<std::ifstream>
               (FrameHeader *fh,basic_ifstream<char,_std::char_traits<char>_> *source)

{
  int retval;
  float local_1c;
  
  std::istream::read((char *)source,(long)&local_1c);
  fh->number = (int32_t)local_1c;
  std::istream::read((char *)source,(long)&local_1c);
  fh->max_data = local_1c._0_2_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->min_data = local_1c._0_2_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->x_offset = local_1c._0_2_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->y_offset = local_1c._0_2_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->x_tilt = local_1c;
  std::istream::read((char *)source,(long)&local_1c);
  fh->y_tilt = local_1c;
  std::istream::read((char *)source,(long)&local_1c);
  fh->is_stimulated = (bool)local_1c._0_1_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->_booked1 = local_1c._0_1_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->_booked2 = local_1c._0_2_;
  std::istream::read((char *)source,(long)&local_1c);
  fh->_booked3 = (int32_t)local_1c;
  std::istream::read((char *)source,(long)&local_1c);
  fh->_booked4 = (int32_t)local_1c;
  return;
}

Assistant:

void read_frame_header_impl(FrameHeader& fh, sourceT& source)
{
    fh.number        = read_binary_as<std::int32_t>(source);
    fh.max_data      = read_binary_as<std::int16_t>(source);
    fh.min_data      = read_binary_as<std::int16_t>(source);
    fh.x_offset      = read_binary_as<std::int16_t>(source);
    fh.y_offset      = read_binary_as<std::int16_t>(source);
    fh.x_tilt        = read_binary_as<float       >(source);
    fh.y_tilt        = read_binary_as<float       >(source);
    fh.is_stimulated = read_binary_as<bool        >(source);
    fh._booked1      = read_binary_as<std::int8_t >(source);
    fh._booked2      = read_binary_as<std::int16_t>(source);
    fh._booked3      = read_binary_as<std::int32_t>(source);
    fh._booked4      = read_binary_as<std::int32_t>(source);
    return;
}